

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trackable_base.h
# Opt level: O2

void __thiscall tower120::trackable_base::move_ctr(trackable_base *this,trackable_base *other)

{
  anon_class_8_1_8991fb9c local_8;
  
  this->first_ptr = other->first_ptr;
  other->first_ptr = (trackable_ptr_base *)0x0;
  local_8.this = this;
  foreach_ptr<tower120::trackable_base::move_ctr(tower120::trackable_base&)::_lambda(tower120::detail::trackable_ptr_base*)_1_>
            (this,&local_8);
  return;
}

Assistant:

void move_ctr(trackable_base& other) noexcept {
            // update trackers with new pointer
            first_ptr       = other.first_ptr;
            other.first_ptr = nullptr;

            foreach_ptr([&](detail::trackable_ptr_base* ptr){
                get_obj(ptr) = this;
            });
        }